

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O2

SamePadding * __thiscall
CoreML::Specification::ConvolutionLayerParams::mutable_same(ConvolutionLayerParams *this)

{
  ValidPadding *this_00;
  
  if (this->_oneof_case_[0] == 0x33) {
    this_00 = (this->ConvolutionPaddingType_).valid_;
  }
  else {
    clear_ConvolutionPaddingType(this);
    this->_oneof_case_[0] = 0x33;
    this_00 = (ValidPadding *)operator_new(0x18);
    SamePadding::SamePadding((SamePadding *)this_00);
    (this->ConvolutionPaddingType_).same_ = (SamePadding *)this_00;
  }
  return (SamePadding *)this_00;
}

Assistant:

inline ::CoreML::Specification::SamePadding* ConvolutionLayerParams::mutable_same() {
  if (!has_same()) {
    clear_ConvolutionPaddingType();
    set_has_same();
    ConvolutionPaddingType_.same_ = new ::CoreML::Specification::SamePadding;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.ConvolutionLayerParams.same)
  return ConvolutionPaddingType_.same_;
}